

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O3

ostream * tcu::Format::operator<<(ostream *str,Array<const_unsigned_long_*> *fmt)

{
  unsigned_long *puVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
  puVar1 = fmt->begin;
  if (puVar1 != fmt->end) {
    do {
      if (puVar1 != fmt->begin) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      }
      std::ostream::_M_insert<unsigned_long>((ulong)str);
      puVar1 = puVar1 + 1;
    } while (puVar1 != fmt->end);
  }
  std::__ostream_insert<char,std::char_traits<char>>(str," }",2);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}